

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O3

void __thiscall
Address_SegwitAddressFromStringTest_Test::TestBody(Address_SegwitAddressFromStringTest_Test *this)

{
  bool bVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__dest;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  Address address;
  AssertHelper local_358;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_350;
  string local_348;
  undefined1 local_320 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  char local_300 [16];
  pointer local_2f0;
  pointer local_2d8;
  pointer local_2c0;
  TapBranch local_2a8;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_230;
  Script local_218;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d8;
  Address local_1a8;
  
  cfd::core::Address::Address(&local_1a8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_348,"bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q","");
      cfd::core::Address::Address((Address *)local_320,&local_348);
      cfd::core::Address::operator=(&local_1a8,(Address *)local_320);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1d8);
      cfd::core::Script::~Script(&local_218);
      local_2a8._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006918c8;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_230);
      cfd::core::TapBranch::~TapBranch(&local_2a8);
      if (local_2c0 != (pointer)0x0) {
        operator_delete(local_2c0);
      }
      if (local_2d8 != (pointer)0x0) {
        operator_delete(local_2d8);
      }
      if (local_2f0 != (pointer)0x0) {
        operator_delete(local_2f0);
      }
      if ((char *)local_310._M_allocated_capacity != local_300) {
        operator_delete((void *)local_310._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_320);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1aa,
               "Expected: (address = Address(\"bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_348,(Message *)local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_348);
    if (CONCAT71(local_320._1_7_,local_320[0]) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_320._1_7_,local_320[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_320._1_7_,local_320[0]) + 8))();
      }
    }
  }
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_320,&local_1a8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_348,"\"bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q\"",
             "address.GetAddress().c_str()","bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q",
             (char *)CONCAT71(local_320._1_7_,local_320[0]));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_320._1_7_,local_320[0]) != &local_310) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_320._1_7_,local_320[0]));
  }
  if ((char)local_348._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_320);
    if ((undefined8 *)local_348._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_348._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1ac,pcVar5);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if (CONCAT71(local_320._1_7_,local_320[0]) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_320._1_7_,local_320[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_320._1_7_,local_320[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_348._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p = local_348._M_dataplus._M_p & 0xffffffff00000000;
  local_358.data_._0_4_ = local_1a8.type_;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)local_320,"NetType::kMainnet","address.GetNetType()",(NetType *)&local_348,
             (NetType *)&local_358);
  if (local_320[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_348);
    if (local_318.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_318.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1ad,pcVar5);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if ((long *)local_348._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_348._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_348._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_318,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p._0_4_ = 4;
  local_358.data_._0_4_ = local_1a8.addr_type_;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_320,"AddressType::kP2wpkhAddress","address.GetAddressType()",
             (AddressType *)&local_348,(AddressType *)&local_358);
  if (local_320[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_348);
    if (local_318.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_318.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1ae,pcVar5);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if ((long *)local_348._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_348._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_348._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_318,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p = local_348._M_dataplus._M_p & 0xffffffff00000000;
  local_358.data_._0_4_ = local_1a8.witness_ver_;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)local_320,"WitnessVersion::kVersion0","address.GetWitnessVersion()",
             (WitnessVersion *)&local_348,(WitnessVersion *)&local_358);
  if (local_320[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_348);
    if (local_318.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_318.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1af,pcVar5);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if ((long *)local_348._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_348._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_348._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_318,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p = (pointer)0x0;
  local_348._M_string_length = 0;
  local_348.field_2._M_allocated_capacity = 0;
  uVar4 = (long)local_1a8.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a8.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    pcVar2 = (pointer)0x0;
    sVar6 = 0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pcVar2 = (pointer)operator_new(uVar4);
    sVar6 = (long)local_1a8.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1a8.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_348.field_2._M_allocated_capacity = (size_type)(pcVar2 + uVar4);
  local_348._M_dataplus._M_p = pcVar2;
  if (local_1a8.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_1a8.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_348._M_string_length = (size_type)pcVar2;
    memmove(pcVar2,local_1a8.hash_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar6);
  }
  local_348._M_string_length = (size_type)(pcVar2 + sVar6);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_320,(ByteData *)&local_348);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_358,"\"925d4028880bd0c9d68fbc7fc7dfee976698629c\"",
             "address.GetHash().GetHex().c_str()","925d4028880bd0c9d68fbc7fc7dfee976698629c",
             (char *)CONCAT71(local_320._1_7_,local_320[0]));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_320._1_7_,local_320[0]) != &local_310) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_320._1_7_,local_320[0]));
  }
  if (local_348._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  if (local_358.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_320);
    if (local_350.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_350.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1b1,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_348,(Message *)local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_348);
    if (CONCAT71(local_320._1_7_,local_320[0]) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_320._1_7_,local_320[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_320._1_7_,local_320[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_350,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p = (pointer)0x0;
  local_348._M_string_length = 0;
  local_348.field_2._M_allocated_capacity = 0;
  uVar4 = (long)local_1a8.pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a8.pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    sVar6 = 0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)operator_new(uVar4);
    sVar6 = (long)local_1a8.pubkey_.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1a8.pubkey_.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_348.field_2._M_allocated_capacity = uVar4 + (long)paVar3;
  local_348._M_dataplus._M_p = (pointer)paVar3;
  if (local_1a8.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_1a8.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_348._M_string_length = (size_type)paVar3;
    memmove(paVar3,local_1a8.pubkey_.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar6);
  }
  local_348._M_string_length = (long)paVar3 + sVar6;
  cfd::core::Pubkey::GetHex_abi_cxx11_((string *)local_320,(Pubkey *)&local_348);
  pcVar5 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_358,"\"\"","address.GetPubkey().GetHex().c_str()","",
             (char *)CONCAT71(local_320._1_7_,local_320[0]));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_320._1_7_,local_320[0]) != &local_310) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_320._1_7_,local_320[0]));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  if (local_358.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_320);
    if (local_350.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = ((local_350.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1b2,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_348,(Message *)local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_348);
    if (CONCAT71(local_320._1_7_,local_320[0]) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_320._1_7_,local_320[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_320._1_7_,local_320[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_350,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::Script((Script *)local_320,&local_1a8.redeem_script_);
  cfd::core::Script::GetHex_abi_cxx11_(&local_348,(Script *)local_320);
  pcVar5 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_358,"\"\"","address.GetScript().GetHex().c_str()","",
             local_348._M_dataplus._M_p);
  paVar3 = &local_348.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != paVar3) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  cfd::core::Script::~Script((Script *)local_320);
  if (local_358.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_320);
    if (local_350.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = ((local_350.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1b3,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_348,(Message *)local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_348);
    if (CONCAT71(local_320._1_7_,local_320[0]) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_320._1_7_,local_320[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_320._1_7_,local_320[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_350,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_348._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_348,
                 "tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt","");
      cfd::core::Address::Address((Address *)local_320,&local_348);
      cfd::core::Address::operator=(&local_1a8,(Address *)local_320);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1d8);
      cfd::core::Script::~Script(&local_218);
      local_2a8._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006918c8;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_230);
      cfd::core::TapBranch::~TapBranch(&local_2a8);
      if (local_2c0 != (pointer)0x0) {
        operator_delete(local_2c0);
      }
      if (local_2d8 != (pointer)0x0) {
        operator_delete(local_2d8);
      }
      if (local_2f0 != (pointer)0x0) {
        operator_delete(local_2f0);
      }
      if ((char *)local_310._M_allocated_capacity != local_300) {
        operator_delete((void *)local_310._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != paVar3) {
        operator_delete(local_348._M_dataplus._M_p);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_320);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1b5,
               "Expected: (address = Address(\"tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_348,(Message *)local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_348);
    if (CONCAT71(local_320._1_7_,local_320[0]) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_320._1_7_,local_320[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_320._1_7_,local_320[0]) + 8))();
      }
    }
  }
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_320,&local_1a8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_348,
             "\"tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt\"",
             "address.GetAddress().c_str()",
             "tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt",
             (char *)CONCAT71(local_320._1_7_,local_320[0]));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_320._1_7_,local_320[0]) != &local_310) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_320._1_7_,local_320[0]));
  }
  if ((char)local_348._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_320);
    if ((undefined8 *)local_348._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_348._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1b7,pcVar5);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if (CONCAT71(local_320._1_7_,local_320[0]) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_320._1_7_,local_320[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_320._1_7_,local_320[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_348._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p._0_4_ = 1;
  local_358.data_._0_4_ = local_1a8.type_;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)local_320,"NetType::kTestnet","address.GetNetType()",(NetType *)&local_348,
             (NetType *)&local_358);
  if (local_320[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_348);
    if (local_318.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_318.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1b8,pcVar5);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if ((long *)local_348._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_348._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_348._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_318,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p._0_4_ = 3;
  local_358.data_._0_4_ = local_1a8.addr_type_;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_320,"AddressType::kP2wshAddress","address.GetAddressType()",
             (AddressType *)&local_348,(AddressType *)&local_358);
  if (local_320[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_348);
    if (local_318.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_318.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1b9,pcVar5);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if ((long *)local_348._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_348._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_348._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_318,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p = local_348._M_dataplus._M_p & 0xffffffff00000000;
  local_358.data_._0_4_ = local_1a8.witness_ver_;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)local_320,"WitnessVersion::kVersion0","address.GetWitnessVersion()",
             (WitnessVersion *)&local_348,(WitnessVersion *)&local_358);
  if (local_320[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_348);
    if (local_318.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_318.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1ba,pcVar5);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_348._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_318,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_348._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_348,"bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6","");
      cfd::core::Address::Address((Address *)local_320,&local_348);
      cfd::core::Address::operator=(&local_1a8,(Address *)local_320);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1d8);
      cfd::core::Script::~Script(&local_218);
      local_2a8._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006918c8;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_230);
      cfd::core::TapBranch::~TapBranch(&local_2a8);
      if (local_2c0 != (pointer)0x0) {
        operator_delete(local_2c0);
      }
      if (local_2d8 != (pointer)0x0) {
        operator_delete(local_2d8);
      }
      if (local_2f0 != (pointer)0x0) {
        operator_delete(local_2f0);
      }
      if ((char *)local_310._M_allocated_capacity != local_300) {
        operator_delete((void *)local_310._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != paVar3) {
        operator_delete(local_348._M_dataplus._M_p);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_320);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1bc,
               "Expected: (address = Address(\"bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_348,(Message *)local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_348);
    if (CONCAT71(local_320._1_7_,local_320[0]) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_320._1_7_,local_320[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_320._1_7_,local_320[0]) + 8))();
      }
    }
  }
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_320,&local_1a8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_348,"\"bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6\"",
             "address.GetAddress().c_str()","bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6",
             (char *)CONCAT71(local_320._1_7_,local_320[0]));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_320._1_7_,local_320[0]) != &local_310) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_320._1_7_,local_320[0]));
  }
  if ((char)local_348._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_320);
    if ((undefined8 *)local_348._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_348._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1be,pcVar5);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if (CONCAT71(local_320._1_7_,local_320[0]) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_320._1_7_,local_320[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_320._1_7_,local_320[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_348._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p._0_4_ = 2;
  local_358.data_._0_4_ = local_1a8.type_;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)local_320,"NetType::kRegtest","address.GetNetType()",(NetType *)&local_348,
             (NetType *)&local_358);
  if (local_320[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_348);
    if (local_318.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_318.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1bf,pcVar5);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if ((long *)local_348._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_348._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_348._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_318,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p._0_4_ = 4;
  local_358.data_._0_4_ = local_1a8.addr_type_;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_320,"AddressType::kP2wpkhAddress","address.GetAddressType()",
             (AddressType *)&local_348,(AddressType *)&local_358);
  if (local_320[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_348);
    if (local_318.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_318.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1c0,pcVar5);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if ((long *)local_348._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_348._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_348._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_318,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p = local_348._M_dataplus._M_p & 0xffffffff00000000;
  local_358.data_._0_4_ = local_1a8.witness_ver_;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)local_320,"WitnessVersion::kVersion0","address.GetWitnessVersion()",
             (WitnessVersion *)&local_348,(WitnessVersion *)&local_358);
  if (local_320[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_348);
    if (local_318.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_318.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1c1,pcVar5);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_348._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_318,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_348._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_348,
                 "bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq","");
      cfd::core::Address::Address((Address *)local_320,&local_348);
      cfd::core::Address::operator=(&local_1a8,(Address *)local_320);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1d8);
      cfd::core::Script::~Script(&local_218);
      local_2a8._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006918c8;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_230);
      cfd::core::TapBranch::~TapBranch(&local_2a8);
      if (local_2c0 != (pointer)0x0) {
        operator_delete(local_2c0);
      }
      if (local_2d8 != (pointer)0x0) {
        operator_delete(local_2d8);
      }
      if (local_2f0 != (pointer)0x0) {
        operator_delete(local_2f0);
      }
      if ((char *)local_310._M_allocated_capacity != local_300) {
        operator_delete((void *)local_310._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != paVar3) {
        operator_delete(local_348._M_dataplus._M_p);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_320);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1c3,
               "Expected: (address = Address(\"bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_348,(Message *)local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_348);
    if (CONCAT71(local_320._1_7_,local_320[0]) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_320._1_7_,local_320[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_320._1_7_,local_320[0]) + 8))();
      }
    }
  }
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_320,&local_1a8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_348,
             "\"bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq\"",
             "address.GetAddress().c_str()",
             "bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq",
             (char *)CONCAT71(local_320._1_7_,local_320[0]));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_320._1_7_,local_320[0]) != &local_310) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_320._1_7_,local_320[0]));
  }
  if ((char)local_348._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_320);
    if ((undefined8 *)local_348._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_348._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1c5,pcVar5);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if (CONCAT71(local_320._1_7_,local_320[0]) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_320._1_7_,local_320[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_320._1_7_,local_320[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_348._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p._0_4_ = 2;
  local_358.data_._0_4_ = local_1a8.type_;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)local_320,"NetType::kRegtest","address.GetNetType()",(NetType *)&local_348,
             (NetType *)&local_358);
  if (local_320[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_348);
    if (local_318.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_318.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1c6,pcVar5);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if ((long *)local_348._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_348._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_348._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_318,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p._0_4_ = 7;
  local_358.data_._0_4_ = local_1a8.addr_type_;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_320,"AddressType::kTaprootAddress","address.GetAddressType()",
             (AddressType *)&local_348,(AddressType *)&local_358);
  if (local_320[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_348);
    if (local_318.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_318.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1c7,pcVar5);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if ((long *)local_348._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_348._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_348._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_318,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p._0_4_ = 1;
  local_358.data_._0_4_ = local_1a8.witness_ver_;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)local_320,"WitnessVersion::kVersion1","address.GetWitnessVersion()",
             (WitnessVersion *)&local_348,(WitnessVersion *)&local_358);
  if (local_320[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_348);
    if (local_318.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_318.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1c8,pcVar5);
    testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    if ((long *)local_348._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_348._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_348._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_318,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p = (pointer)0x0;
  local_348._M_string_length = 0;
  local_348.field_2._M_allocated_capacity = 0;
  uVar4 = (long)local_1a8.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a8.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    pcVar2 = (pointer)0x0;
    sVar6 = 0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pcVar2 = (pointer)operator_new(uVar4);
    sVar6 = (long)local_1a8.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1a8.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_348.field_2._M_allocated_capacity = (size_type)(pcVar2 + uVar4);
  local_348._M_dataplus._M_p = pcVar2;
  if (local_1a8.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_1a8.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_348._M_string_length = (size_type)pcVar2;
    memmove(pcVar2,local_1a8.hash_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar6);
  }
  local_348._M_string_length = (size_type)(pcVar2 + sVar6);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_320,(ByteData *)&local_348);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_358,
             "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"",
             "address.GetHash().GetHex().c_str()",
             "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
             (char *)CONCAT71(local_320._1_7_,local_320[0]));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_320._1_7_,local_320[0]) != &local_310) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_320._1_7_,local_320[0]));
  }
  if (local_348._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  if (local_358.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_320);
    if (local_350.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_350.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1ca,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_348,(Message *)local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_348);
    if (CONCAT71(local_320._1_7_,local_320[0]) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_320._1_7_,local_320[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_320._1_7_,local_320[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_350,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p = (pointer)0x0;
  local_348._M_string_length = 0;
  local_348.field_2._M_allocated_capacity = 0;
  uVar4 = (long)local_1a8.schnorr_pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a8.schnorr_pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    __dest = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    sVar6 = 0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    __dest = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)operator_new(uVar4);
    sVar6 = (long)local_1a8.schnorr_pubkey_.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1a8.schnorr_pubkey_.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_348.field_2._M_allocated_capacity = uVar4 + (long)__dest;
  local_348._M_dataplus._M_p = (pointer)__dest;
  if (local_1a8.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_1a8.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_348._M_string_length = (size_type)__dest;
    memmove(__dest,local_1a8.schnorr_pubkey_.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar6);
  }
  local_348._M_string_length = (long)__dest + sVar6;
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)local_320,(SchnorrPubkey *)&local_348);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_358,
             "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"",
             "address.GetSchnorrPubkey().GetHex().c_str()",
             "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
             (char *)CONCAT71(local_320._1_7_,local_320[0]));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_320._1_7_,local_320[0]) != &local_310) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_320._1_7_,local_320[0]));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  if (local_358.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_320);
    if (local_350.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_350.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1cc,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_348,(Message *)local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_348);
    if (CONCAT71(local_320._1_7_,local_320[0]) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_320._1_7_,local_320[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_320._1_7_,local_320[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_350,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_348._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_348,"bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujx6","");
    cfd::core::Address::Address((Address *)local_320,&local_348);
    cfd::core::Address::operator=(&local_1a8,(Address *)local_320);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_1d8);
    cfd::core::Script::~Script(&local_218);
    local_2a8._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006918c8;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_230);
    cfd::core::TapBranch::~TapBranch(&local_2a8);
    if (local_2c0 != (pointer)0x0) {
      operator_delete(local_2c0);
    }
    if (local_2d8 != (pointer)0x0) {
      operator_delete(local_2d8);
    }
    if (local_2f0 != (pointer)0x0) {
      operator_delete(local_2f0);
    }
    if ((char *)local_310._M_allocated_capacity != local_300) {
      operator_delete((void *)local_310._M_allocated_capacity);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != paVar3) {
      operator_delete(local_348._M_dataplus._M_p);
    }
  }
  testing::Message::Message((Message *)local_320);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_348,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
             ,0x1d0,
             "Expected: (address = Address(\"bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujx6\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_348,(Message *)local_320);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_348);
  if (CONCAT71(local_320._1_7_,local_320[0]) != 0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((long *)CONCAT71(local_320._1_7_,local_320[0]) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_320._1_7_,local_320[0]) + 8))();
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_1a8.format_data_);
  cfd::core::Script::~Script(&local_1a8.redeem_script_);
  local_1a8.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_006918c8;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_1a8.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_1a8.script_tree_.super_TapBranch);
  if (local_1a8.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1a8.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1a8.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8.address_._M_dataplus._M_p != &local_1a8.address_.field_2) {
    operator_delete(local_1a8.address_._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(Address, SegwitAddressFromStringTest) {
  Address address;
  EXPECT_NO_THROW((address = Address("bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q")));
  EXPECT_STREQ("bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kMainnet, address.GetNetType());
  EXPECT_EQ(AddressType::kP2wpkhAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion0, address.GetWitnessVersion());
  EXPECT_STREQ("925d4028880bd0c9d68fbc7fc7dfee976698629c",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("", address.GetPubkey().GetHex().c_str());
  EXPECT_STREQ("", address.GetScript().GetHex().c_str());

  EXPECT_NO_THROW((address = Address("tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt")));
  EXPECT_STREQ("tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kTestnet, address.GetNetType());
  EXPECT_EQ(AddressType::kP2wshAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion0, address.GetWitnessVersion());

  EXPECT_NO_THROW((address = Address("bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6")));
  EXPECT_STREQ("bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kRegtest, address.GetNetType());
  EXPECT_EQ(AddressType::kP2wpkhAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion0, address.GetWitnessVersion());

  EXPECT_NO_THROW((address = Address("bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq")));
  EXPECT_STREQ("bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kRegtest, address.GetNetType());
  EXPECT_EQ(AddressType::kTaprootAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion1, address.GetWitnessVersion());
  EXPECT_STREQ("1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
              address.GetHash().GetHex().c_str());
  EXPECT_STREQ("1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
              address.GetSchnorrPubkey().GetHex().c_str());

  // Illegal data
  EXPECT_THROW((address = Address("bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujx6")),
               CfdException);
}